

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O1

Position * __thiscall iDynTree::Position::changeRefPoint(Position *this,Position *newRefPoint)

{
  (this->super_Vector3).m_data[0] =
       (newRefPoint->super_Vector3).m_data[0] + (this->super_Vector3).m_data[0];
  (this->super_Vector3).m_data[1] =
       (newRefPoint->super_Vector3).m_data[1] + (this->super_Vector3).m_data[1];
  (this->super_Vector3).m_data[2] =
       (newRefPoint->super_Vector3).m_data[2] + (this->super_Vector3).m_data[2];
  return this;
}

Assistant:

const Position& Position::changeRefPoint(const Position& newRefPoint)
    {
        this->m_data[0] += newRefPoint(0);
        this->m_data[1] += newRefPoint(1);
        this->m_data[2] += newRefPoint(2);

        return *this;
    }